

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

void secp256k1_modinv32_update_de_30
               (secp256k1_modinv32_signed30 *d,secp256k1_modinv32_signed30 *e,
               secp256k1_modinv32_trans2x2 *t,secp256k1_modinv32_modinfo *modinfo)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  uint uVar35;
  uint uVar36;
  undefined4 uVar37;
  uint extraout_EAX;
  secp256k1_modinv32_signed30 *psVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  uint uVar44;
  uint uVar45;
  int extraout_EDX;
  int extraout_EDX_00;
  int32_t *piVar46;
  secp256k1_modinv32_signed30 *b;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  secp256k1_modinv32_signed30 *psVar53;
  secp256k1_fe *r;
  long lVar54;
  ulong uVar55;
  uint64_t uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  secp256k1_fe *a;
  ulong uVar60;
  secp256k1_fe *a_00;
  secp256k1_modinv32_signed30 *a_01;
  long lVar61;
  ulong uVar62;
  secp256k1_fe *r_00;
  secp256k1_fe *r_01;
  uint uVar63;
  uint uVar64;
  ulong uVar65;
  ulong uVar66;
  uint uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  long lVar75;
  uint uVar76;
  secp256k1_modinv32_modinfo *psVar77;
  uint uVar78;
  secp256k1_modinv32_modinfo *psVar79;
  ulong uVar80;
  uint64_t uVar81;
  secp256k1_fe *a_02;
  uint uVar82;
  uint64_t uVar83;
  code *pcVar84;
  code *pcVar85;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  undefined1 auVar86 [16];
  uint extraout_XMM0_Dd;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  uchar auStack_2a8 [32];
  secp256k1_fe *psStack_288;
  ulong uStack_280;
  ulong uStack_278;
  secp256k1_fe *psStack_270;
  code *pcStack_268;
  code *pcStack_258;
  undefined1 auStack_250 [32];
  secp256k1_fe sStack_230;
  undefined1 auStack_200 [16];
  secp256k1_fe sStack_1e8;
  ulong uStack_1b8;
  secp256k1_fe *psStack_1b0;
  uint64_t uStack_1a8;
  code *pcStack_1a0;
  long lStack_190;
  secp256k1_fe sStack_188;
  secp256k1_fe *psStack_150;
  secp256k1_fe sStack_148;
  secp256k1_fe sStack_118;
  ulong uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  secp256k1_modinv32_signed30 *psStack_c8;
  ulong uStack_c0;
  code *pcStack_b8;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  secp256k1_modinv32_signed30 *psStack_98;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  int32_t iStack_7c;
  secp256k1_modinv32_signed30 *psStack_78;
  secp256k1_modinv32_modinfo *psStack_70;
  secp256k1_modinv32_modinfo *psStack_68;
  secp256k1_modinv32_signed30 *psStack_60;
  secp256k1_modinv32_signed30 *psStack_58;
  code *pcStack_50;
  long local_40;
  long local_38;
  
  uVar58 = t->u;
  psVar79 = (secp256k1_modinv32_modinfo *)(long)(int)uVar58;
  uVar45 = t->v;
  lVar54 = (long)(int)uVar45;
  uVar59 = t->q;
  psVar53 = (secp256k1_modinv32_signed30 *)(long)(int)uVar59;
  local_40 = (long)t->r;
  a = (secp256k1_fe *)0x9;
  pcStack_50 = (code *)0x156018;
  a_01 = d;
  iVar34 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,-2);
  if (iVar34 < 1) {
    pcStack_50 = (code *)0x156280;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_00156280:
    pcStack_50 = (code *)0x156285;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_00156285:
    pcStack_50 = (code *)0x15628a;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0015628a:
    pcStack_50 = (code *)0x15628f;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0015628f:
    pcStack_50 = (code *)0x156294;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_00156294:
    pcStack_50 = (code *)0x156299;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_00156299:
    pcStack_50 = (code *)0x15629e;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0015629e:
    pcStack_50 = (code *)0x1562a3;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar77 = modinfo;
LAB_001562a3:
    pcStack_50 = (code *)0x1562a8;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_001562a8:
    pcStack_50 = (code *)0x1562ad;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_001562ad:
    pcStack_50 = (code *)0x1562b2;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    a = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x156035;
    a_01 = d;
    iVar34 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,1);
    if (-1 < iVar34) goto LAB_00156280;
    a = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x156052;
    a_01 = e;
    iVar34 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,-2);
    if (iVar34 < 1) goto LAB_00156285;
    a = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x15606f;
    a_01 = e;
    iVar34 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,1);
    if (-1 < iVar34) goto LAB_0015628a;
    psVar77 = (secp256k1_modinv32_modinfo *)-(long)psVar79;
    if (0 < (long)psVar79) {
      psVar77 = psVar79;
    }
    lVar39 = -lVar54;
    if (lVar54 < 1) {
      lVar39 = lVar54;
    }
    if (lVar39 + 0x40000000 < (long)psVar77) goto LAB_0015628f;
    psVar38 = (secp256k1_modinv32_signed30 *)-(long)psVar53;
    if (0 < (long)psVar53) {
      psVar38 = psVar53;
    }
    lVar39 = -local_40;
    if (local_40 < 1) {
      lVar39 = local_40;
    }
    if (lVar39 + 0x40000000 < (long)psVar38) goto LAB_00156294;
    uVar63 = d->v[8] >> 0x1f;
    uVar57 = e->v[8] >> 0x1f;
    a = (secp256k1_fe *)(ulong)uVar57;
    iVar34 = (uVar57 & uVar45) + (uVar63 & uVar58);
    a_01 = (secp256k1_modinv32_signed30 *)(e->v[0] * lVar54 + (long)d->v[0] * (long)psVar79);
    lVar39 = (long)(modinfo->modulus).v[0];
    lVar43 = (long)(int)(iVar34 - ((int)a_01 * modinfo->modulus_inv30 + iVar34 & 0x3fffffff));
    piVar46 = (int32_t *)((long)a_01->v + lVar43 * lVar39);
    if (((ulong)piVar46 & 0x3fffffff) != 0) goto LAB_00156299;
    iVar34 = (uVar57 & (uint)local_40) + (uVar63 & uVar59);
    lVar75 = e->v[0] * local_40 + (long)d->v[0] * (long)psVar53;
    a_01 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar58 = iVar34 - (modinfo->modulus_inv30 * (int)lVar75 + iVar34 & 0x3fffffff);
    a = (secp256k1_fe *)(ulong)uVar58;
    uVar40 = lVar39 * (int)uVar58 + lVar75;
    local_38 = lVar43;
    if ((uVar40 & 0x3fffffff) != 0) goto LAB_0015629e;
    lVar39 = (long)uVar40 >> 0x1e;
    lVar75 = (long)piVar46 >> 0x1e;
    lVar61 = 1;
    do {
      lVar41 = (long)(modinfo->modulus).v[lVar61];
      lVar75 = lVar41 * lVar43 + e->v[lVar61] * lVar54 + (long)d->v[lVar61] * (long)psVar79 + lVar75
      ;
      psVar77 = (secp256k1_modinv32_modinfo *)(e->v[lVar61] * local_40);
      lVar39 = (long)(psVar77->modulus).v +
               (long)d->v[lVar61] * (long)psVar53 + lVar39 + lVar41 * (int)uVar58;
      d->v[lVar61 + -1] = (uint)lVar75 & 0x3fffffff;
      e->v[lVar61 + -1] = (uint)lVar39 & 0x3fffffff;
      lVar61 = lVar61 + 1;
      lVar39 = lVar39 >> 0x1e;
      lVar75 = lVar75 >> 0x1e;
    } while (lVar61 != 9);
    d->v[8] = (int32_t)lVar75;
    e->v[8] = (int32_t)lVar39;
    a = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x156219;
    a_01 = d;
    iVar34 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,-2);
    psVar53 = e;
    psVar79 = modinfo;
    if (iVar34 < 1) goto LAB_001562a3;
    a = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x156236;
    a_01 = d;
    iVar34 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,1);
    if (-1 < iVar34) goto LAB_001562a8;
    a = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x15624f;
    a_01 = e;
    iVar34 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,-2);
    if (iVar34 < 1) goto LAB_001562ad;
    a = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x156268;
    a_01 = e;
    iVar34 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,1);
    if (iVar34 < 0) {
      return;
    }
  }
  pcStack_50 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  uVar58 = a_01->v[0];
  uVar47 = (ulong)uVar58;
  uVar45 = a_01->v[3];
  uVar55 = (ulong)uVar45;
  uVar59 = a_01->v[4];
  uVar80 = (ulong)uVar59;
  uVar57 = a_01->v[5];
  uVar42 = (ulong)uVar57;
  psVar38 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_01->v[6];
  uVar63 = a_01->v[7];
  uVar40 = (ulong)uVar63;
  iStack_7c = a_01->v[8];
  lVar39 = 0;
  do {
    psStack_78 = psVar53;
    psStack_70 = psVar77;
    psStack_68 = psVar79;
    psStack_60 = e;
    psStack_58 = d;
    pcStack_50 = (code *)lVar54;
    if (a_01->v[lVar39] < -0x3fffffff) {
      pcStack_b8 = (code *)0x156600;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_00156600:
      pcStack_b8 = (code *)0x156605;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_00156605;
    }
    if (0x3fffffff < a_01->v[lVar39]) goto LAB_00156600;
    lVar39 = lVar39 + 1;
  } while (lVar39 != 9);
  uStack_9c = (uint)a;
  a = (secp256k1_fe *)0x9;
  pcStack_b8 = (code *)0x15633d;
  psVar38 = a_01;
  uStack_a8 = a_01->v[1];
  uStack_a4 = a_01->v[2];
  uStack_a0 = a_01->v[6];
  psStack_98 = b;
  iVar34 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar34 < 1) {
LAB_00156605:
    pcStack_b8 = (code *)0x15660a;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0015660a:
    pcStack_b8 = (code *)0x15660f;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0015660f:
    pcStack_b8 = (code *)0x156614;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_00156614:
    pcStack_b8 = (code *)0x156619;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    a = (secp256k1_fe *)0x9;
    pcStack_b8 = (code *)0x15635c;
    psVar38 = a_01;
    iVar34 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_98,1);
    if (-1 < iVar34) goto LAB_0015660a;
    uVar35 = iStack_7c >> 0x1f;
    uStack_80 = psStack_98->v[1];
    uVar36 = (uVar35 & uStack_80) + uStack_a8;
    uStack_a8 = psStack_98->v[2];
    uVar44 = (uVar35 & uStack_a8) + uStack_a4;
    uStack_a4 = psStack_98->v[3];
    uStack_84 = psStack_98->v[4];
    uStack_88 = psStack_98->v[5];
    uStack_8c = psStack_98->v[6];
    uVar78 = (uVar35 & uStack_8c) + uStack_a0;
    uStack_a0 = psStack_98->v[7];
    uStack_ac = (int)uStack_9c >> 0x1f;
    uStack_9c = psStack_98->v[8];
    uVar67 = ((uVar35 & psStack_98->v[0]) + uVar58 ^ uStack_ac) - uStack_ac;
    uVar64 = ((int)uVar67 >> 0x1e) + ((uVar36 ^ uStack_ac) - uStack_ac);
    uVar36 = ((int)uVar64 >> 0x1e) + ((uVar44 ^ uStack_ac) - uStack_ac);
    uVar82 = ((int)uVar36 >> 0x1e) + (((uVar35 & uStack_a4) + uVar45 ^ uStack_ac) - uStack_ac);
    uVar45 = ((int)uVar82 >> 0x1e) + (((uVar35 & uStack_84) + uVar59 ^ uStack_ac) - uStack_ac);
    uVar58 = ((int)uVar45 >> 0x1e) + (((uVar35 & uStack_88) + uVar57 ^ uStack_ac) - uStack_ac);
    uVar59 = ((int)uVar58 >> 0x1e) + ((uVar78 ^ uStack_ac) - uStack_ac);
    uVar57 = ((int)uVar59 >> 0x1e) + (((uVar35 & uStack_a0) + uVar63 ^ uStack_ac) - uStack_ac);
    uVar76 = ((int)uVar57 >> 0x1e) + (((uVar35 & uStack_9c) + iStack_7c ^ uStack_ac) - uStack_ac);
    uVar42 = (ulong)uVar76;
    uStack_b0 = (int)uVar76 >> 0x1f;
    uVar78 = (psStack_98->v[0] & uStack_b0) + (uVar67 & 0x3fffffff);
    uVar44 = (uStack_88 & uStack_b0) + (uVar58 & 0x3fffffff);
    uVar47 = (ulong)uVar44;
    uVar67 = (uStack_8c & uStack_b0) + (uVar59 & 0x3fffffff);
    uVar55 = (ulong)uVar67;
    uVar58 = ((int)uVar78 >> 0x1e) + (uStack_80 & uStack_b0) + (uVar64 & 0x3fffffff);
    uVar59 = ((int)uVar58 >> 0x1e) + (uStack_a8 & uStack_b0) + (uVar36 & 0x3fffffff);
    uVar63 = ((int)uVar59 >> 0x1e) + (uStack_a4 & uStack_b0) + (uVar82 & 0x3fffffff);
    uVar35 = ((int)uVar63 >> 0x1e) + (uStack_84 & uStack_b0) + (uVar45 & 0x3fffffff);
    uVar44 = ((int)uVar35 >> 0x1e) + uVar44;
    uVar67 = ((int)uVar44 >> 0x1e) + uVar67;
    uVar45 = ((int)uVar67 >> 0x1e) + (uStack_a0 & uStack_b0) + (uVar57 & 0x3fffffff);
    uVar57 = ((int)uVar45 >> 0x1e) + (uStack_9c & uStack_b0) + uVar76;
    uVar80 = (ulong)uVar57;
    uVar63 = uVar63 & 0x3fffffff;
    a = (secp256k1_fe *)(ulong)uVar63;
    uVar35 = uVar35 & 0x3fffffff;
    psVar38 = (secp256k1_modinv32_signed30 *)(ulong)uVar35;
    uVar45 = uVar45 & 0x3fffffff;
    uVar40 = (ulong)uVar45;
    a_01->v[0] = uVar78 & 0x3fffffff;
    a_01->v[1] = uVar58 & 0x3fffffff;
    a_01->v[2] = uVar59 & 0x3fffffff;
    a_01->v[3] = uVar63;
    a_01->v[4] = uVar35;
    a_01->v[5] = uVar44 & 0x3fffffff;
    a_01->v[6] = uVar67 & 0x3fffffff;
    a_01->v[7] = uVar45;
    a_01->v[8] = uVar57;
    if (0x3fffffff < uVar57) goto LAB_0015660f;
    a = (secp256k1_fe *)0x9;
    pcStack_b8 = (code *)0x1565cd;
    psVar38 = a_01;
    iVar34 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_98,0);
    if (iVar34 < 0) goto LAB_00156614;
    a = (secp256k1_fe *)0x9;
    pcStack_b8 = (code *)0x1565e8;
    psVar38 = a_01;
    iVar34 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_98,1);
    if (iVar34 < 0) {
      return;
    }
  }
  pcStack_b8 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_150 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX == 0) {
    psStack_150 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_1a0 = (code *)0x156655;
  uStack_e0 = uVar40;
  uStack_d8 = uVar42;
  uStack_d0 = uVar55;
  psStack_c8 = a_01;
  uStack_c0 = uVar47;
  pcStack_b8 = (code *)uVar80;
  (*(code *)psStack_150)(&sStack_188);
  if (psVar38 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar38->v + 8) = sStack_188.n[4];
    *(ulong *)(psVar38[1].v + 1) = CONCAT44(sStack_188.normalized,sStack_188.magnitude);
    *(uint64_t *)(psVar38->v + 4) = sStack_188.n[2];
    *(uint64_t *)(psVar38->v + 6) = sStack_188.n[3];
    *(uint64_t *)psVar38->v = sStack_188.n[0];
    *(uint64_t *)(psVar38->v + 2) = sStack_188.n[1];
  }
  uVar83 = 0xfffffffffffff;
  uVar80 = 0xf000000000000;
  uVar55 = 0xffffffffffff;
  uVar40 = 0x1000003d0;
  sStack_118.n[0] = a->n[0];
  sStack_118.n[1] = a->n[1];
  sStack_118.n[2] = a->n[2];
  sStack_118.n[3] = a->n[3];
  sStack_118.n[4] = a->n[4];
  sStack_118.magnitude = a->magnitude;
  sStack_118.normalized = a->normalized;
  a_02 = &sStack_118;
  pcStack_1a0 = (code *)0x1566cc;
  secp256k1_fe_verify(a_02);
  lStack_190 = 0x1000003d1;
  uVar42 = (sStack_118.n[4] >> 0x30) * 0x1000003d1 + sStack_118.n[0];
  if (((uVar42 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar42 & 0xfffffffffffff) == 0)) {
    uVar47 = (uVar42 >> 0x34) + sStack_118.n[1];
    uVar60 = (uVar47 >> 0x34) + sStack_118.n[2];
    uVar62 = (uVar60 >> 0x34) + sStack_118.n[3];
    uVar65 = (uVar62 >> 0x34) + (sStack_118.n[4] & 0xffffffffffff);
    if ((((uVar47 | uVar42 | uVar60 | uVar62) & 0xfffffffffffff) != 0 || uVar65 != 0) &&
       (((uVar42 | 0x1000003d0) & uVar47 & uVar60 & uVar62 & (uVar65 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0015676f;
LAB_00156b83:
    a = &sStack_188;
    pcStack_1a0 = (code *)0x156b90;
    secp256k1_fe_verify(a);
    uVar55 = uVar55 & sStack_188.n[4];
    uVar42 = (sStack_188.n[4] >> 0x30) * lStack_190 + sStack_188.n[0];
    uVar47 = (uVar42 >> 0x34) + sStack_188.n[1];
    uVar60 = (uVar47 >> 0x34) + sStack_188.n[2];
    a_00 = (secp256k1_fe *)((uVar60 >> 0x34) + sStack_188.n[3]);
    uVar62 = ((ulong)a_00 >> 0x34) + uVar55;
    if ((((uVar47 | uVar42 | uVar60 | (ulong)a_00) & uVar83) == 0 && uVar62 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar62 ^ uVar80),
       ((uVar42 ^ uVar40) & uVar47 & uVar60 & (ulong)a_00 & (ulong)r_00) == uVar83)) {
      return;
    }
  }
  else {
LAB_0015676f:
    pcStack_1a0 = (code *)0x156787;
    a_00 = a;
    secp256k1_fe_mul(&sStack_118,a,&sStack_188);
    pcStack_1a0 = (code *)0x15678f;
    secp256k1_fe_verify(&sStack_118);
    r_00 = &fe_minus_one;
    pcStack_1a0 = (code *)0x15679b;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_118.magnitude < 0x20) {
      sStack_118.n[0] = sStack_118.n[0] + 0xffffefffffc2e;
      sStack_118.n[1] = sStack_118.n[1] + 0xfffffffffffff;
      sStack_118.n[2] = sStack_118.n[2] + 0xfffffffffffff;
      sStack_118.n[3] = sStack_118.n[3] + 0xfffffffffffff;
      sStack_118.n[4] = sStack_118.n[4] + 0xffffffffffff;
      sStack_118.normalized = 0;
      sStack_118.magnitude = sStack_118.magnitude + 1;
      pcStack_1a0 = (code *)0x1567f0;
      secp256k1_fe_verify(&sStack_118);
      pcStack_1a0 = (code *)0x1567f8;
      secp256k1_fe_verify(&sStack_118);
      uVar42 = (sStack_118.n[4] >> 0x30) * lStack_190 + sStack_118.n[0];
      uVar55 = (uVar42 >> 0x34) + sStack_118.n[1];
      uVar47 = (uVar55 >> 0x34) + sStack_118.n[2];
      a_00 = (secp256k1_fe *)((uVar47 >> 0x34) + sStack_118.n[3]);
      uVar60 = ((ulong)a_00 >> 0x34) + (sStack_118.n[4] & 0xffffffffffff);
      if ((((uVar55 | uVar42 | uVar47 | (ulong)a_00) & 0xfffffffffffff) != 0 || uVar60 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar60 ^ 0xf000000000000),
         ((uVar42 ^ 0x1000003d0) & uVar55 & uVar47 & (ulong)a_00 & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_00156c11;
      sStack_148.n[0] = a->n[0];
      sStack_148.n[1] = a->n[1];
      sStack_148.n[2] = a->n[2];
      sStack_148.n[3] = a->n[3];
      sStack_148.n[4] = a->n[4];
      sStack_148.magnitude = a->magnitude;
      sStack_148.normalized = a->normalized;
      a = &sStack_148;
      pcStack_1a0 = (code *)0x156890;
      secp256k1_fe_verify(a);
      r_00 = &fe_minus_one;
      pcStack_1a0 = (code *)0x15689c;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_148.magnitude) goto LAB_00156c16;
      uVar56 = sStack_148.n[0] + 0xffffefffffc2e;
      uVar81 = sStack_148.n[1] + 0xfffffffffffff;
      uVar83 = sStack_148.n[2] + 0xfffffffffffff;
      uVar80 = sStack_148.n[3] + 0xfffffffffffff;
      uVar40 = sStack_148.n[4] + 0xffffffffffff;
      sStack_148.normalized = 0;
      sStack_148.magnitude = sStack_148.magnitude + 1;
      pcStack_1a0 = (code *)0x156911;
      sStack_148.n[0] = uVar56;
      sStack_148.n[1] = uVar81;
      sStack_148.n[2] = uVar83;
      sStack_148.n[3] = uVar80;
      sStack_148.n[4] = uVar40;
      secp256k1_fe_verify(&sStack_148);
      pcStack_1a0 = (code *)0x156919;
      secp256k1_fe_verify(&sStack_148);
      a_02 = psStack_150;
      uVar42 = (uVar40 >> 0x30) * lStack_190 + uVar56;
      if (((uVar42 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar42 & 0xfffffffffffff) == 0)) {
        uVar40 = uVar40 & 0xffffffffffff;
        uVar62 = uVar81 + (uVar42 >> 0x34);
        uVar55 = (uVar62 >> 0x34) + uVar83;
        uVar47 = (uVar55 >> 0x34) + uVar80;
        uVar60 = (uVar47 >> 0x34) + uVar40;
        if (((uVar62 | uVar42 | uVar55 | uVar47) & 0xfffffffffffff) == 0 && uVar60 == 0) {
          return;
        }
        if (((uVar42 | 0x1000003d0) & uVar62 & uVar55 & uVar47 & (uVar60 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      a_00 = &sStack_148;
      pcStack_1a0 = (code *)0x1569d9;
      (*(code *)psStack_150)();
      a = &sStack_188;
      pcStack_1a0 = (code *)0x1569e6;
      secp256k1_fe_verify(a);
      r_00 = &fe_minus_one;
      pcStack_1a0 = (code *)0x1569f2;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_188.magnitude) goto LAB_00156c1b;
      a = &sStack_188;
      sStack_188.n[0] = sStack_188.n[0] + 0xffffefffffc2e;
      sStack_188.n[1] = sStack_188.n[1] + 0xfffffffffffff;
      sStack_188.n[2] = sStack_188.n[2] + 0xfffffffffffff;
      sStack_188.n[3] = sStack_188.n[3] + 0xfffffffffffff;
      sStack_188.n[4] = sStack_188.n[4] + 0xffffffffffff;
      sStack_188.magnitude = sStack_188.magnitude + 1;
      uVar55 = 0;
      sStack_188.normalized = 0;
      pcStack_1a0 = (code *)0x156a3b;
      secp256k1_fe_verify(a);
      pcStack_1a0 = (code *)0x156a44;
      a_00 = a;
      (*(code *)a_02)(a);
      pcStack_1a0 = (code *)0x156a4c;
      secp256k1_fe_verify(a);
      sStack_188.n[0] = sStack_188.n[0] + 1;
      sStack_188.magnitude = sStack_188.magnitude + 1;
      sStack_188.normalized = 0;
      pcStack_1a0 = (code *)0x156a5d;
      secp256k1_fe_verify(a);
      pcStack_1a0 = (code *)0x156a65;
      secp256k1_fe_verify(a);
      a_02 = &sStack_148;
      pcStack_1a0 = (code *)0x156a72;
      r_00 = a_02;
      secp256k1_fe_verify(a_02);
      if (sStack_148.magnitude + sStack_188.magnitude < 0x21) {
        sStack_188.n[0] = sStack_188.n[0] + sStack_148.n[0];
        sStack_188.n[1] = sStack_188.n[1] + sStack_148.n[1];
        sStack_188.n[2] = sStack_188.n[2] + sStack_148.n[2];
        sStack_188.n[3] = sStack_188.n[3] + sStack_148.n[3];
        sStack_188.n[4] = sStack_188.n[4] + sStack_148.n[4];
        sStack_188.normalized = 0;
        pcStack_1a0 = (code *)0x156ac0;
        sStack_188.magnitude = sStack_148.magnitude + sStack_188.magnitude;
        secp256k1_fe_verify(&sStack_188);
        pcStack_1a0 = (code *)0x156ac8;
        secp256k1_fe_verify(&sStack_188);
        uVar42 = (sStack_188.n[4] >> 0x30) * lStack_190 + sStack_188.n[0];
        if (((uVar42 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar42 & 0xfffffffffffff) == 0)) {
          uVar47 = (uVar42 >> 0x34) + sStack_188.n[1];
          uVar60 = (uVar47 >> 0x34) + sStack_188.n[2];
          uVar62 = (uVar60 >> 0x34) + sStack_188.n[3];
          uVar65 = (uVar62 >> 0x34) + (sStack_188.n[4] & 0xffffffffffff);
          if (((uVar47 | uVar42 | uVar60 | uVar62) & 0xfffffffffffff) == 0 && uVar65 == 0) {
            return;
          }
          if (((uVar42 | 0x1000003d0) & uVar47 & uVar60 & uVar62 & (uVar65 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_1a0 = (code *)0x156b83;
        test_inverse_field_cold_2();
        goto LAB_00156b83;
      }
    }
    else {
      pcStack_1a0 = (code *)0x156c11;
      test_inverse_field_cold_7();
LAB_00156c11:
      pcStack_1a0 = (code *)0x156c16;
      test_inverse_field_cold_6();
LAB_00156c16:
      a_02 = &sStack_118;
      pcStack_1a0 = (code *)0x156c1b;
      test_inverse_field_cold_5();
LAB_00156c1b:
      uVar55 = 0xffffffffffff;
      pcStack_1a0 = (code *)0x156c20;
      test_inverse_field_cold_4();
    }
    pcStack_1a0 = (code *)0x156c25;
    test_inverse_field_cold_3();
  }
  pcStack_1a0 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcVar84 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_00 == 0) {
    pcVar84 = secp256k1_scalar_inverse;
  }
  r = (secp256k1_fe *)auStack_250;
  pcStack_268 = (code *)0x156c60;
  r_01 = r;
  sStack_1e8.n[4] = (uint64_t)a;
  sStack_1e8._40_8_ = uVar40;
  uStack_1b8 = uVar80;
  psStack_1b0 = a_02;
  uStack_1a8 = uVar83;
  pcStack_1a0 = (code *)uVar55;
  uVar37 = (*pcVar84)();
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_250._20_4_,auStack_250._16_4_);
    r_00->n[3] = CONCAT44(auStack_250._28_4_,auStack_250._24_4_);
    r_00->n[0] = CONCAT44(auStack_250._4_4_,auStack_250._0_4_);
    r_00->n[1] = CONCAT44(auStack_250._12_4_,auStack_250._8_4_);
  }
  uVar45 = 0;
  uVar59 = 0;
  uVar57 = 0;
  uVar63 = 0;
  auVar87._0_4_ = -(uint)((int)a_00->n[2] == 0 && (int)a_00->n[0] == 0);
  auVar87._4_4_ = -(uint)(*(int *)((long)a_00->n + 0x14) == 0 && *(int *)((long)a_00->n + 4) == 0);
  auVar87._8_4_ = -(uint)((int)a_00->n[3] == 0 && (int)a_00->n[1] == 0);
  auVar87._12_4_ =
       -(uint)(*(int *)((long)a_00->n + 0x1c) == 0 && *(int *)((long)a_00->n + 0xc) == 0);
  uVar58 = movmskps(uVar37,auVar87);
  uVar58 = uVar58 ^ 0xf;
  if (uVar58 != 0) {
    uVar42 = a_00->n[0];
    uVar55 = a_00->n[1];
    uVar47 = a_00->n[2];
    uVar52 = CONCAT44(auStack_250._4_4_,auStack_250._0_4_);
    uVar40 = CONCAT44(auStack_250._12_4_,auStack_250._8_4_);
    uVar80 = CONCAT44(auStack_250._20_4_,auStack_250._16_4_);
    r_00 = (secp256k1_fe *)CONCAT44(auStack_250._28_4_,auStack_250._24_4_);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar42;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar52;
    uVar48 = SUB168(auVar1 * auVar17,8);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar48;
    sStack_230.n[0] = SUB168(auVar1 * auVar17,0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar42;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar40;
    auVar2 = auVar2 * auVar18;
    uVar66 = SUB168(auVar2 + auVar33,0);
    uVar68 = SUB168(auVar2 + auVar33,8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar55;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar52;
    uVar49 = SUB168(auVar3 * auVar19,8);
    uVar65 = SUB168(auVar3 * auVar19,0);
    uVar60 = (ulong)CARRY8(uVar66,uVar65);
    uVar62 = uVar68 + uVar49;
    uVar69 = uVar62 + uVar60;
    uVar71 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar48,auVar2._0_8_)) +
             (ulong)(CARRY8(uVar68,uVar49) || CARRY8(uVar62,uVar60));
    sStack_230.n[1] = uVar66 + uVar65;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar42;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar80;
    uVar50 = SUB168(auVar4 * auVar20,8);
    uVar60 = SUB168(auVar4 * auVar20,0);
    uVar65 = uVar69 + uVar60;
    uVar60 = (ulong)CARRY8(uVar69,uVar60);
    uVar48 = uVar71 + uVar50;
    uVar72 = uVar48 + uVar60;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar55;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar40;
    uVar69 = SUB168(auVar5 * auVar21,8);
    uVar62 = SUB168(auVar5 * auVar21,0);
    uVar70 = uVar65 + uVar62;
    uVar62 = (ulong)CARRY8(uVar65,uVar62);
    uVar49 = uVar72 + uVar69;
    uVar73 = uVar49 + uVar62;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar47;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar52;
    uVar51 = SUB168(auVar6 * auVar22,8);
    uVar68 = SUB168(auVar6 * auVar22,0);
    uVar65 = (ulong)CARRY8(uVar70,uVar68);
    uVar66 = uVar73 + uVar51;
    uVar74 = uVar66 + uVar65;
    uVar71 = (ulong)(CARRY8(uVar71,uVar50) || CARRY8(uVar48,uVar60)) +
             (ulong)(CARRY8(uVar72,uVar69) || CARRY8(uVar49,uVar62)) +
             (ulong)(CARRY8(uVar73,uVar51) || CARRY8(uVar66,uVar65));
    sStack_230.n[2] = uVar70 + uVar68;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar42;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = r_00;
    uVar68 = SUB168(auVar7 * auVar23,8);
    uVar42 = SUB168(auVar7 * auVar23,0);
    uVar62 = uVar74 + uVar42;
    uVar42 = (ulong)CARRY8(uVar74,uVar42);
    uVar48 = uVar71 + uVar68;
    uVar70 = uVar48 + uVar42;
    pcVar85 = (code *)a_00->n[3];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar55;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar80;
    uVar50 = SUB168(auVar8 * auVar24,8);
    uVar60 = SUB168(auVar8 * auVar24,0);
    uVar65 = uVar62 + uVar60;
    uVar60 = (ulong)CARRY8(uVar62,uVar60);
    uVar49 = uVar70 + uVar50;
    uVar72 = uVar49 + uVar60;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar47;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar40;
    uVar69 = SUB168(auVar9 * auVar25,8);
    uVar62 = SUB168(auVar9 * auVar25,0);
    uVar74 = uVar65 + uVar62;
    uVar62 = (ulong)CARRY8(uVar65,uVar62);
    uVar66 = uVar72 + uVar69;
    uVar73 = uVar66 + uVar62;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = pcVar85;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar52;
    uVar51 = SUB168(auVar10 * auVar26,8);
    uVar65 = SUB168(auVar10 * auVar26,0);
    sStack_230.n[3] = uVar74 + uVar65;
    uVar65 = (ulong)CARRY8(uVar74,uVar65);
    uVar52 = uVar73 + uVar51;
    uVar74 = uVar52 + uVar65;
    uVar68 = (ulong)(CARRY8(uVar71,uVar68) || CARRY8(uVar48,uVar42)) +
             (ulong)(CARRY8(uVar70,uVar50) || CARRY8(uVar49,uVar60)) +
             (ulong)(CARRY8(uVar72,uVar69) || CARRY8(uVar66,uVar62)) +
             (ulong)(CARRY8(uVar73,uVar51) || CARRY8(uVar52,uVar65));
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar55;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = r_00;
    uVar49 = SUB168(auVar11 * auVar27,8);
    uVar42 = SUB168(auVar11 * auVar27,0);
    uVar60 = uVar74 + uVar42;
    uVar42 = (ulong)CARRY8(uVar74,uVar42);
    uVar62 = uVar68 + uVar49;
    uVar50 = uVar62 + uVar42;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar47;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar80;
    uVar66 = SUB168(auVar12 * auVar28,8);
    uVar55 = SUB168(auVar12 * auVar28,0);
    uVar48 = uVar60 + uVar55;
    uVar55 = (ulong)CARRY8(uVar60,uVar55);
    uVar65 = uVar50 + uVar66;
    uVar69 = uVar65 + uVar55;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = pcVar85;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar40;
    uVar52 = SUB168(auVar13 * auVar29,8);
    uVar60 = SUB168(auVar13 * auVar29,0);
    sStack_230.n[4] = uVar48 + uVar60;
    uVar60 = (ulong)CARRY8(uVar48,uVar60);
    uVar48 = uVar69 + uVar52;
    uVar51 = uVar48 + uVar60;
    uVar48 = (ulong)(CARRY8(uVar68,uVar49) || CARRY8(uVar62,uVar42)) +
             (ulong)(CARRY8(uVar50,uVar66) || CARRY8(uVar65,uVar55)) +
             (ulong)(CARRY8(uVar69,uVar52) || CARRY8(uVar48,uVar60));
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar47;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = r_00;
    uVar62 = SUB168(auVar14 * auVar30,8);
    uVar42 = SUB168(auVar14 * auVar30,0);
    uVar60 = uVar51 + uVar42;
    uVar42 = (ulong)CARRY8(uVar51,uVar42);
    uVar47 = uVar48 + uVar62;
    uVar49 = uVar47 + uVar42;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = pcVar85;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar80;
    uVar65 = SUB168(auVar15 * auVar31,8);
    uVar55 = SUB168(auVar15 * auVar31,0);
    sStack_230._40_8_ = uVar60 + uVar55;
    uVar55 = (ulong)CARRY8(uVar60,uVar55);
    uVar60 = uVar49 + uVar65;
    auStack_200._8_8_ =
         (ulong)(CARRY8(uVar48,uVar62) || CARRY8(uVar47,uVar42)) +
         (ulong)(CARRY8(uVar49,uVar65) || CARRY8(uVar60,uVar55));
    auStack_200._0_8_ = uVar60 + uVar55;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = pcVar85;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = r_00;
    auStack_200 = auVar16 * auVar32 + auStack_200;
    r = &sStack_1e8;
    pcStack_268 = (code *)0x156dfb;
    r_01 = r;
    pcStack_258 = pcVar84;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)r,(uint64_t *)(auStack_250 + 0x20));
    if (((sStack_1e8.n[0] != 1 || sStack_1e8.n[1] != 0) || sStack_1e8.n[2] != 0) ||
        sStack_1e8.n[3] != 0) {
      pcStack_268 = (code *)0x156ef2;
      test_inverse_scalar_cold_1();
      goto LAB_00156ef2;
    }
    pcStack_268 = (code *)0x156e2b;
    iVar34 = secp256k1_scalar_add
                       ((secp256k1_scalar *)(auStack_250 + 0x20),(secp256k1_scalar *)a_00,
                        &scalar_minus_one);
    pcVar84 = pcStack_258;
    auVar86._0_4_ = -(uint)((int)sStack_230.n[2] == 0 && (int)sStack_230.n[0] == 0);
    auVar86._4_4_ = -(uint)(sStack_230.n[2]._4_4_ == 0 && sStack_230.n[0]._4_4_ == 0);
    auVar86._8_4_ = -(uint)((int)sStack_230.n[3] == 0 && (int)sStack_230.n[1] == 0);
    auVar86._12_4_ = -(uint)(sStack_230.n[3]._4_4_ == 0 && sStack_230.n[1]._4_4_ == 0);
    iVar34 = movmskps(iVar34,auVar86);
    if (iVar34 == 0xf) {
      return;
    }
    r = (secp256k1_fe *)(auStack_250 + 0x20);
    pcStack_268 = (code *)0x156e5b;
    (*pcStack_258)(r,r);
    r_00 = (secp256k1_fe *)auStack_250;
    pcStack_268 = (code *)0x156e72;
    secp256k1_scalar_add((secp256k1_scalar *)r_00,&scalar_minus_one,(secp256k1_scalar *)r_00);
    pcStack_268 = (code *)0x156e7b;
    (*pcVar84)(r_00,r_00);
    pcStack_268 = (code *)0x156e8d;
    secp256k1_scalar_add((secp256k1_scalar *)r_00,(secp256k1_scalar *)r_00,&secp256k1_scalar_one);
    pcStack_268 = (code *)0x156e9b;
    r_01 = r_00;
    iVar34 = secp256k1_scalar_add
                       ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)r_00);
    auVar88._0_4_ = -(uint)(auStack_250._16_4_ == 0 && auStack_250._0_4_ == 0);
    auVar88._4_4_ = -(uint)(auStack_250._20_4_ == 0 && auStack_250._4_4_ == 0);
    auVar88._8_4_ = -(uint)(auStack_250._24_4_ == 0 && auStack_250._8_4_ == 0);
    auVar88._12_4_ = -(uint)(auStack_250._28_4_ == 0 && auStack_250._12_4_ == 0);
    iVar34 = movmskps(iVar34,auVar88);
    if (iVar34 == 0xf) {
      return;
    }
    pcStack_268 = (code *)0x156ebf;
    test_inverse_scalar_cold_2();
    uVar58 = extraout_EAX;
    uVar45 = extraout_XMM0_Da;
    uVar59 = extraout_XMM0_Db;
    uVar57 = extraout_XMM0_Dc;
    uVar63 = extraout_XMM0_Dd;
  }
  auVar89._0_4_ = -(uint)((auStack_250._16_4_ | auStack_250._0_4_) == uVar45);
  auVar89._4_4_ = -(uint)((auStack_250._20_4_ | auStack_250._4_4_) == uVar59);
  auVar89._8_4_ = -(uint)((auStack_250._24_4_ | auStack_250._8_4_) == uVar57);
  auVar89._12_4_ = -(uint)((auStack_250._28_4_ | auStack_250._12_4_) == uVar63);
  iVar34 = movmskps(uVar58,auVar89);
  pcVar85 = pcVar84;
  if (iVar34 == 0xf) {
    return;
  }
LAB_00156ef2:
  pcStack_268 = random_fe;
  test_inverse_scalar_cold_3();
  psStack_288 = r;
  uStack_280 = uVar40;
  uStack_278 = uVar80;
  psStack_270 = r_00;
  pcStack_268 = pcVar85;
  while( true ) {
    secp256k1_testrand256(auStack_2a8);
    secp256k1_fe_impl_set_b32_mod(r_01,auStack_2a8);
    if (((r_01->n[0] < 0xffffefffffc2f) || (r_01->n[4] != 0xffffffffffff)) ||
       ((r_01->n[2] & r_01->n[3] & r_01->n[1]) != 0xfffffffffffff)) break;
    r_01->magnitude = -1;
  }
  r_01->magnitude = 1;
  r_01->normalized = 1;
  secp256k1_fe_verify(r_01);
  return;
}

Assistant:

static void secp256k1_modinv32_update_de_30(secp256k1_modinv32_signed30 *d, secp256k1_modinv32_signed30 *e, const secp256k1_modinv32_trans2x2 *t, const secp256k1_modinv32_modinfo* modinfo) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    const int32_t u = t->u, v = t->v, q = t->q, r = t->r;
    int32_t di, ei, md, me, sd, se;
    int64_t cd, ce;
    int i;
#ifdef VERIFY
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(labs(u) <= (M30 + 1 - labs(v))); /* |u|+|v| <= 2^30 */
    VERIFY_CHECK(labs(q) <= (M30 + 1 - labs(r))); /* |q|+|r| <= 2^30 */
#endif
    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d->v[8] >> 31;
    se = e->v[8] >> 31;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    di = d->v[0];
    ei = e->v[0];
    cd = (int64_t)u * di + (int64_t)v * ei;
    ce = (int64_t)q * di + (int64_t)r * ei;
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 30 zero bottom bits. */
    md -= (modinfo->modulus_inv30 * (uint32_t)cd + md) & M30;
    me -= (modinfo->modulus_inv30 * (uint32_t)ce + me) & M30;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    cd += (int64_t)modinfo->modulus.v[0] * md;
    ce += (int64_t)modinfo->modulus.v[0] * me;
    /* Verify that the low 30 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK(((int32_t)cd & M30) == 0); cd >>= 30;
    VERIFY_CHECK(((int32_t)ce & M30) == 0); ce >>= 30;
    /* Now iteratively compute limb i=1..8 of t*[d,e]+modulus*[md,me], and store them in output
     * limb i-1 (shifting down by 30 bits). */
    for (i = 1; i < 9; ++i) {
        di = d->v[i];
        ei = e->v[i];
        cd += (int64_t)u * di + (int64_t)v * ei;
        ce += (int64_t)q * di + (int64_t)r * ei;
        cd += (int64_t)modinfo->modulus.v[i] * md;
        ce += (int64_t)modinfo->modulus.v[i] * me;
        d->v[i - 1] = (int32_t)cd & M30; cd >>= 30;
        e->v[i - 1] = (int32_t)ce & M30; ce >>= 30;
    }
    /* What remains is limb 9 of t*[d,e]+modulus*[md,me]; store it as output limb 8. */
    d->v[8] = (int32_t)cd;
    e->v[8] = (int32_t)ce;
#ifdef VERIFY
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
#endif
}